

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

void __thiscall
acto::intrusive::mpsc_stack<acto::core::worker_t>::push
          (mpsc_stack<acto::core::worker_t> *this,worker_t *node)

{
  bool bVar1;
  worker_t *top;
  
  do {
    top = (this->head_)._M_b._M_p;
    (node->super_node<acto::core::worker_t>).next = top;
    bVar1 = std::atomic<acto::core::worker_t_*>::compare_exchange_weak
                      (&this->head_,&top,node,seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void push(T* const node) noexcept {
    do {
      T* top = head_.load(std::memory_order_relaxed);
      node->next = top;
      if (head_.compare_exchange_weak(top, node)) {
        return;
      }
    } while (true);
  }